

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O1

Reals Omega_h::inertia::anon_unknown_0::get_distances(Reals *coords,Vector<3> center,Vector<3> axis)

{
  int *piVar1;
  double *pdVar2;
  ulong *puVar3;
  double dVar4;
  Alloc *pAVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar6;
  ulong *in_RSI;
  long lVar7;
  Int i;
  long lVar8;
  undefined8 uVar9;
  int iVar10;
  ulong uVar11;
  _Alloc_hider _Var12;
  IntIterator last;
  Reals RVar13;
  type f;
  Vector<3> c;
  Write<double> local_e8;
  Write<double> local_d8;
  double local_c8 [4];
  string local_a8;
  double local_88;
  double dStack_80;
  double local_78;
  double local_70;
  double dStack_68;
  double local_60;
  double local_58 [6];
  
  puVar3 = (ulong *)*in_RSI;
  if (((ulong)puVar3 & 1) == 0) {
    uVar11 = *puVar3;
  }
  else {
    uVar11 = (ulong)puVar3 >> 3;
  }
  iVar10 = (int)(uVar11 >> 3);
  if (iVar10 * -0x55555555 + 0x2aaaaaaaU < 0x55555555) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
    Write<double>::Write(&local_e8,iVar10 / 3,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    local_a8._M_dataplus._M_p = (pointer)local_e8.shared_alloc_.alloc;
    if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 &&
        local_e8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_a8._M_dataplus._M_p = (pointer)((local_e8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_e8.shared_alloc_.alloc)->use_count = (local_e8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_a8._M_string_length = (size_type)local_e8.shared_alloc_.direct_ptr;
    local_a8.field_2._M_allocated_capacity = *in_RSI;
    if ((local_a8.field_2._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_a8.field_2._M_allocated_capacity != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_a8.field_2._M_allocated_capacity =
             ((Alloc *)local_a8.field_2._M_allocated_capacity)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_a8.field_2._M_allocated_capacity)->use_count =
             ((Alloc *)local_a8.field_2._M_allocated_capacity)->use_count + 1;
      }
    }
    local_a8.field_2._8_8_ = in_RSI[1];
    local_88 = center.super_Few<double,_3>.array_[0];
    dStack_80 = center.super_Few<double,_3>.array_[1];
    local_78 = center.super_Few<double,_3>.array_[2];
    local_70 = axis.super_Few<double,_3>.array_[0];
    dStack_68 = axis.super_Few<double,_3>.array_[1];
    local_60 = axis.super_Few<double,_3>.array_[2];
    _Var12._M_p = local_a8._M_dataplus._M_p;
    if (((ulong)local_a8._M_dataplus._M_p & 7) == 0 &&
        (Alloc *)local_a8._M_dataplus._M_p != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        _Var12._M_p = (pointer)(*(long *)local_a8._M_dataplus._M_p * 8 + 1);
      }
      else {
        *(int *)(local_a8._M_dataplus._M_p + 0x30) = *(int *)(local_a8._M_dataplus._M_p + 0x30) + 1;
      }
    }
    uVar9 = local_a8.field_2._M_allocated_capacity;
    if ((local_a8.field_2._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_a8.field_2._M_allocated_capacity != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        uVar9 = (Alloc *)(*(long *)local_a8.field_2._M_allocated_capacity * 8 + 1);
      }
      else {
        *(int *)(local_a8.field_2._M_allocated_capacity + 0x30) =
             *(int *)(local_a8.field_2._M_allocated_capacity + 0x30) + 1;
      }
    }
    if (2 < iVar10) {
      if (((ulong)_Var12._M_p & 7) == 0 && (Alloc *)_Var12._M_p != (Alloc *)0x0) {
        ((Alloc *)_Var12._M_p)->use_count = ((Alloc *)_Var12._M_p)->use_count + -1;
        _Var12._M_p = (pointer)(((Alloc *)_Var12._M_p)->size * 8 + 1);
      }
      if ((uVar9 & 7) == 0 && (Alloc *)uVar9 != (Alloc *)0x0) {
        ((Alloc *)uVar9)->use_count = ((Alloc *)uVar9)->use_count + -1;
        uVar9 = ((Alloc *)uVar9)->size * 8 + 1;
      }
      entering_parallel = '\0';
      lVar7 = 0;
      do {
        local_c8[2] = center.super_Few<double,_3>.array_[2];
        local_c8[0] = center.super_Few<double,_3>.array_[0];
        local_c8[1] = center.super_Few<double,_3>.array_[1];
        local_58[2] = (double)*(undefined8 *)(local_a8.field_2._8_8_ + 0x10 + lVar7 * 0x18);
        pdVar2 = (double *)(local_a8.field_2._8_8_ + lVar7 * 0x18);
        local_58[0] = *pdVar2;
        local_58[1] = pdVar2[1];
        lVar8 = 0;
        do {
          local_58[lVar8 + 3] = local_58[lVar8] - local_c8[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        local_c8[0] = axis.super_Few<double,_3>.array_[0];
        local_c8[1] = axis.super_Few<double,_3>.array_[1];
        local_c8[2] = axis.super_Few<double,_3>.array_[2];
        dVar4 = local_58[3] * axis.super_Few<double,_3>.array_[0];
        lVar8 = 1;
        do {
          dVar4 = dVar4 + local_58[lVar8 + 3] * local_c8[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        *(double *)((long)local_e8.shared_alloc_.direct_ptr + lVar7 * 8) = dVar4;
        lVar7 = lVar7 + 1;
      } while (iVar10 / 3 != (int)lVar7);
      if ((uVar9 & 7) == 0 && (Alloc *)uVar9 != (Alloc *)0x0) {
        piVar1 = &((Alloc *)uVar9)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc((Alloc *)uVar9);
          operator_delete((void *)uVar9,0x48);
        }
      }
      if (((ulong)_Var12._M_p & 7) == 0 && (Alloc *)_Var12._M_p != (Alloc *)0x0) {
        piVar1 = &((Alloc *)_Var12._M_p)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc((Alloc *)_Var12._M_p);
          operator_delete(_Var12._M_p,0x48);
        }
      }
      _Var12._M_p = (pointer)0x0;
      uVar9 = (Alloc *)0x0;
    }
    if ((uVar9 & 7) == 0 && (Alloc *)uVar9 != (Alloc *)0x0) {
      piVar1 = &((Alloc *)uVar9)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)uVar9);
        operator_delete((void *)uVar9,0x48);
      }
    }
    if (((ulong)_Var12._M_p & 7) == 0 && (Alloc *)_Var12._M_p != (Alloc *)0x0) {
      piVar1 = &((Alloc *)_Var12._M_p)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)_Var12._M_p);
        operator_delete(_Var12._M_p,0x48);
      }
    }
    local_d8.shared_alloc_.alloc = local_e8.shared_alloc_.alloc;
    local_d8.shared_alloc_.direct_ptr = local_e8.shared_alloc_.direct_ptr;
    if ((((ulong)local_e8.shared_alloc_.alloc & 7) == 0 &&
         local_e8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_e8.shared_alloc_.alloc)->use_count = (local_e8.shared_alloc_.alloc)->use_count + -1;
      local_d8.shared_alloc_.alloc = (Alloc *)((local_e8.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_e8.shared_alloc_.alloc = (Alloc *)0x0;
    local_e8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<double>::Read((Read<signed_char> *)coords,&local_d8);
    pAVar5 = local_d8.shared_alloc_.alloc;
    pvVar6 = extraout_RDX;
    if (((ulong)local_d8.shared_alloc_.alloc & 7) == 0 &&
        local_d8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_d8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_d8.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
        pvVar6 = extraout_RDX_00;
      }
    }
    uVar9 = local_a8.field_2._M_allocated_capacity;
    if ((local_a8.field_2._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_a8.field_2._M_allocated_capacity != (Alloc *)0x0) {
      piVar1 = (int *)(local_a8.field_2._M_allocated_capacity + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_a8.field_2._M_allocated_capacity);
        operator_delete((void *)uVar9,0x48);
        pvVar6 = extraout_RDX_01;
      }
    }
    _Var12._M_p = local_a8._M_dataplus._M_p;
    if (((ulong)local_a8._M_dataplus._M_p & 7) == 0 &&
        (Alloc *)local_a8._M_dataplus._M_p != (Alloc *)0x0) {
      piVar1 = (int *)(local_a8._M_dataplus._M_p + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_a8._M_dataplus._M_p);
        operator_delete(_Var12._M_p,0x48);
        pvVar6 = extraout_RDX_02;
      }
    }
    pAVar5 = local_e8.shared_alloc_.alloc;
    if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 &&
        local_e8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_e8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_e8.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
        pvVar6 = extraout_RDX_03;
      }
    }
    RVar13.write_.shared_alloc_.direct_ptr = pvVar6;
    RVar13.write_.shared_alloc_.alloc = (Alloc *)coords;
    return (Reals)RVar13.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a % b == 0",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
       ,0x11a);
}

Assistant:

Reals get_distances(Reals coords, Vector<3> center, Vector<3> axis) {
  auto n = divide_no_remainder(coords.size(), 3);
  Write<Real> distances(n);
  auto f = OMEGA_H_LAMBDA(LO i) {
    distances[i] = (get_vector<3>(coords, i) - center) * axis;
  };
  parallel_for(n, f, "get_distances");
  return distances;
}